

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

int __thiscall
asmjit::v1_14::BitVectorRangeIterator<unsigned_long,_0U>::init
          (BitVectorRangeIterator<unsigned_long,_0U> *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  byte in_CL;
  undefined7 in_register_00000009;
  ulong in_RDX;
  unsigned_long uVar2;
  ulong in_R8;
  
  if (in_R8 + 0x3f >> 6 <= in_RDX) {
    uVar1 = CONCAT71(in_register_00000009,in_CL) & 0xffffffffffffffc0;
    if (uVar1 < in_R8) {
      uVar2 = (~*(ulong *)(ctx + (CONCAT71(in_register_00000009,in_CL) >> 6) * 8) >> (in_CL & 0x3f))
              << (in_CL & 0x3f);
    }
    else {
      uVar2 = 0;
    }
    this->_ptr = (unsigned_long *)(ctx + (CONCAT71(in_register_00000009,in_CL) >> 6) * 8);
    this->_idx = uVar1;
    this->_end = in_R8;
    this->_bitWord = uVar2;
    return (int)uVar1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitallocator.cpp"
             ,0x4c,"numBitWords >= (end + kBitWordSize - 1) / kBitWordSize");
}

Assistant:

ASMJIT_FORCE_INLINE void init(const T* data, size_t numBitWords, size_t start, size_t end) noexcept {
    ASMJIT_ASSERT(numBitWords >= (end + kBitWordSize - 1) / kBitWordSize);
    DebugUtils::unused(numBitWords);

    size_t idx = Support::alignDown(start, kBitWordSize);
    const T* ptr = data + (idx / kBitWordSize);

    T bitWord = 0;
    if (idx < end)
      bitWord = (*ptr ^ kXorMask) & (Support::allOnes<T>() << (start % kBitWordSize));

    _ptr = ptr;
    _idx = idx;
    _end = end;
    _bitWord = bitWord;
  }